

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

UniValue * __thiscall
NetinfoRequestHandler::PrepareRequest
          (UniValue *__return_storage_ptr__,NetinfoRequestHandler *this,string *method,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  UniValue val;
  UniValue val_00;
  bool bVar1;
  const_reference pvVar2;
  runtime_error *this_00;
  uint8_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long in_FS_OFFSET;
  string_view str;
  string in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe98 [56];
  UniValue local_120;
  uint8_t n;
  UniValue local_a8;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    n = '\0';
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(args,0);
    str._M_str = (pvVar2->_M_dataplus)._M_p;
    str._M_len = pvVar2->_M_string_length;
    bVar1 = ParseUInt8(str,&n);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(args,0);
      tinyformat::format<std::__cxx11::string>
                ((string *)&local_120,
                 (tinyformat *)
                 "invalid -netinfo argument: %s\nFor more information, run: bitcoin-cli -netinfo help"
                 ,(char *)pvVar2,args_00);
      std::runtime_error::runtime_error(this_00,(string *)&local_120);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0011fedd;
    }
    uVar3 = '\x04';
    if (n < 4) {
      uVar3 = n;
    }
    this->m_details_level = uVar3;
  }
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VARR,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&n,"getpeerinfo",(allocator<char> *)&stack0xfffffffffffffe87);
  UniValue::UniValue<const_int_&,_int,_true>(&local_120,&ID_PEERINFO);
  JSONRPCRequestObj(&local_a8,(string *)&n,&NullUniValue,&local_120);
  val._32_56_ = in_stack_fffffffffffffe98;
  val._0_32_ = in_stack_fffffffffffffe78;
  UniValue::push_back(__return_storage_ptr__,val);
  UniValue::~UniValue(&local_a8);
  UniValue::~UniValue(&local_120);
  std::__cxx11::string::~string((string *)&n);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&n,"getnetworkinfo",(allocator<char> *)&stack0xfffffffffffffe87);
  UniValue::UniValue<const_int_&,_int,_true>(&local_120,&ID_NETWORKINFO);
  JSONRPCRequestObj((UniValue *)&stack0xfffffffffffffe88,(string *)&n,&NullUniValue,&local_120);
  val_00._32_56_ = in_stack_fffffffffffffe98;
  val_00._0_32_ = in_stack_fffffffffffffe78;
  UniValue::push_back(__return_storage_ptr__,val_00);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe88);
  UniValue::~UniValue(&local_120);
  std::__cxx11::string::~string((string *)&n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0011fedd:
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        if (!args.empty()) {
            uint8_t n{0};
            if (ParseUInt8(args.at(0), &n)) {
                m_details_level = std::min(n, MAX_DETAIL_LEVEL);
            } else {
                throw std::runtime_error(strprintf("invalid -netinfo argument: %s\nFor more information, run: bitcoin-cli -netinfo help", args.at(0)));
            }
        }
        UniValue result(UniValue::VARR);
        result.push_back(JSONRPCRequestObj("getpeerinfo", NullUniValue, ID_PEERINFO));
        result.push_back(JSONRPCRequestObj("getnetworkinfo", NullUniValue, ID_NETWORKINFO));
        return result;
    }